

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_html_generator.cc
# Opt level: O0

void __thiscall t_html_generator::generate_css(t_html_generator *this)

{
  char *pcVar1;
  int __oflag;
  ofstream_with_content_based_conditional_update *f_target;
  allocator local_81;
  string local_80 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_30 [8];
  string css_fname;
  t_html_generator *this_local;
  
  if ((this->standalone_ & 1U) == 0) {
    css_fname.field_2._8_8_ = this;
    std::__cxx11::string::operator=((string *)&this->current_file_,"style.css");
    (*(this->super_t_generator)._vptr_t_generator[0x1b])();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                   &local_50,&this->current_file_);
    std::__cxx11::string::~string((string *)&local_50);
    pcVar1 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,pcVar1,&local_81);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
              (&this->f_out_,(char *)local_80,__oflag);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    f_target = &this->f_out_;
    generate_css_content(this,(ostream *)f_target);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
              (&this->f_out_,(int)f_target);
    std::__cxx11::string::~string((string *)local_30);
  }
  return;
}

Assistant:

void t_html_generator::generate_css() {
  if (!standalone_) {
    current_file_ = "style.css";
    string css_fname = get_out_dir() + current_file_;
    f_out_.open(css_fname.c_str());
    generate_css_content(f_out_);
    f_out_.close();
  }
}